

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
SetObjectRaw(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *this,Member *members,SizeType count,
            MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  Member *members_00;
  size_t in_RCX;
  SizeType in_EDX;
  void *in_RSI;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RDI;
  Member *m;
  undefined4 in_stack_ffffffffffffffe8;
  
  (in_RDI->data_).f.flags = 3;
  if (in_EDX == 0) {
    SetMembersPointer(in_RDI,(Member *)0x0);
  }
  else {
    members_00 = (Member *)
                 MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc
                           ((MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                            CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_RCX);
    SetMembersPointer(in_RDI,members_00);
    memcpy(members_00,in_RSI,(ulong)in_EDX << 5);
  }
  (in_RDI->data_).s.hashcode = in_EDX;
  (in_RDI->data_).s.length = in_EDX;
  return;
}

Assistant:

void SetObjectRaw(Member* members, SizeType count, Allocator& allocator) {
        data_.f.flags = kObjectFlag;
        if (count) {
            Member* m = static_cast<Member*>(allocator.Malloc(count * sizeof(Member)));
            SetMembersPointer(m);
            std::memcpy(static_cast<void*>(m), members, count * sizeof(Member));
        }
        else
            SetMembersPointer(0);
        data_.o.size = data_.o.capacity = count;
    }